

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

void latin1_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  do {
    pbVar3 = (byte *)*fromP;
    while( true ) {
      if (pbVar3 == (byte *)fromLim) {
        return;
      }
      bVar1 = *pbVar3;
      pbVar2 = (byte *)*toP;
      if (-1 < (char)bVar1) break;
      if ((long)toLim - (long)pbVar2 < 2) {
        return;
      }
      *toP = (char *)(pbVar2 + 1);
      *pbVar2 = bVar1 >> 6 | 0xc0;
      pbVar3 = (byte *)*toP;
      *toP = (char *)(pbVar3 + 1);
      *pbVar3 = bVar1 & 0xbf;
      pbVar3 = (byte *)(*fromP + 1);
      *fromP = (char *)pbVar3;
    }
    if (pbVar2 == (byte *)toLim) {
      return;
    }
    *fromP = (char *)(pbVar3 + 1);
    bVar1 = *pbVar3;
    pbVar3 = (byte *)*toP;
    *toP = (char *)(pbVar3 + 1);
    *pbVar3 = bVar1;
  } while( true );
}

Assistant:

static
void latin1_toUtf8(const ENCODING *enc,
                   const char **fromP, const char *fromLim,
                   char **toP, const char *toLim)
{
  cmExpatUnused(enc);
  for (;;) {
    unsigned char c;
    if (*fromP == fromLim)
      break;
    c = (unsigned char)**fromP;
    if (c & 0x80) {
      if (toLim - *toP < 2)
        break;
      *(*toP)++ = ((c >> 6) | UTF8_cval2);
      *(*toP)++ = ((c & 0x3f) | 0x80);
      (*fromP)++;
    }
    else {
      if (*toP == toLim)
        break;
      *(*toP)++ = *(*fromP)++;
    }
  }
}